

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O2

TestRequired * __thiscall
proto2_unittest::TestRequiredMessage::_internal_mutable_optional_message(TestRequiredMessage *this)

{
  TestRequired *pTVar1;
  Arena *arena;
  
  pTVar1 = (this->field_0)._impl_.optional_message_;
  if (pTVar1 != (TestRequired *)0x0) {
    return pTVar1;
  }
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pTVar1 = (TestRequired *)
           google::protobuf::Arena::DefaultConstruct<proto2_unittest::TestRequired>(arena);
  (this->field_0)._impl_.optional_message_ = pTVar1;
  return pTVar1;
}

Assistant:

inline ::proto2_unittest::TestRequired* PROTOBUF_NONNULL TestRequiredMessage::_internal_mutable_optional_message() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.optional_message_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::proto2_unittest::TestRequired>(GetArena());
    _impl_.optional_message_ = reinterpret_cast<::proto2_unittest::TestRequired*>(p);
  }
  return _impl_.optional_message_;
}